

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int stem(char **pz,char *zFrom,char *zTo,_func_int_char_ptr *xCond)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  pcVar4 = *pz;
  bVar5 = *zFrom == '\0';
  if (!bVar5) {
    if (*zFrom == *pcVar4) {
      pcVar3 = zFrom + 1;
      do {
        pcVar4 = pcVar4 + 1;
        cVar1 = *pcVar3;
        bVar5 = cVar1 == '\0';
        if (bVar5) goto LAB_001b7d9e;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 == *pcVar4);
    }
    if (!bVar5) {
      return 0;
    }
  }
LAB_001b7d9e:
  if ((xCond == (_func_int_char_ptr *)0x0) || (iVar2 = (*xCond)(pcVar4), iVar2 != 0)) {
    cVar1 = *zTo;
    while (cVar1 != '\0') {
      zTo = zTo + 1;
      pcVar4[-1] = cVar1;
      pcVar4 = pcVar4 + -1;
      cVar1 = *zTo;
    }
    *pz = pcVar4;
  }
  return 1;
}

Assistant:

static int stem(
  char **pz,             /* The word being stemmed (Reversed) */
  const char *zFrom,     /* If the ending matches this... (Reversed) */
  const char *zTo,       /* ... change the ending to this (not reversed) */
  int (*xCond)(const char*)   /* Condition that must be true */
){
  char *z = *pz;
  while( *zFrom && *zFrom==*z ){ z++; zFrom++; }
  if( *zFrom!=0 ) return 0;
  if( xCond && !xCond(z) ) return 1;
  while( *zTo ){
    *(--z) = *(zTo++);
  }
  *pz = z;
  return 1;
}